

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O1

void __thiscall
IO::momentsActive(IO *this,vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> *sims,
                 string *filename)

{
  pointer ppMVar1;
  ModelInstance *pMVar2;
  float *pfVar3;
  char cVar4;
  ostream *poVar5;
  float *pfVar6;
  pointer ppMVar7;
  ofstream outstream;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((string *)&local_230);
  std::ofstream::open((string *)&local_230,(_Ios_Openmode)filename);
  ppMVar1 = (sims->super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppMVar7 = (sims->super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>).
                 _M_impl.super__Vector_impl_data._M_start; ppMVar7 != ppMVar1; ppMVar7 = ppMVar7 + 1
      ) {
    pMVar2 = *ppMVar7;
    pfVar3 = (pMVar2->dimersactive)._M_elems[0].super__Vector_base<float,_std::allocator<float>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pfVar6 = (pMVar2->dimersactive)._M_elems[0].
                  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                  _M_start; pfVar6 != pfVar3; pfVar6 = pfVar6 + 1) {
      poVar5 = std::ostream::_M_insert<double>((double)*pfVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t",1);
    }
    cVar4 = (char)(string *)&local_230;
    std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar4);
    std::ostream::put(cVar4);
    std::ostream::flush();
    pfVar3 = (pMVar2->dimersactive)._M_elems[1].super__Vector_base<float,_std::allocator<float>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pfVar6 = (pMVar2->dimersactive)._M_elems[1].
                  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                  _M_start; pfVar6 != pfVar3; pfVar6 = pfVar6 + 1) {
      poVar5 = std::ostream::_M_insert<double>((double)*pfVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t",1);
    }
    std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar4);
    std::ostream::put(cVar4);
    std::ostream::flush();
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void IO::momentsActive(std::vector<ModelInstance*> sims, std::string filename){
	std::ofstream outstream;
	outstream.open(filename, std::ios::app);
	for (ModelInstance* model: sims){
		for (auto i: model->dimersactive.at(0)){
			outstream << i << "\t";
		}
		outstream << std::endl;
		for (auto i: model->dimersactive.at(1)){
			outstream << i << "\t";
		}
		outstream << std::endl;
	}
	outstream.close();
}